

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprForVectorField(Parse *pParse,Expr *pVector,int iField)

{
  Expr *pEVar1;
  int in_EDX;
  sqlite3 *in_RSI;
  Expr *pRet;
  Expr *in_stack_ffffffffffffffd8;
  Expr *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*(char *)&in_RSI->pVfs == '\x7f') {
    pEVar1 = sqlite3PExpr((Parse *)in_RSI,in_EDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8
                         );
    if (pEVar1 != (Expr *)0x0) {
      pEVar1->iColumn = (ynVar)in_EDX;
      pEVar1->pLeft = (Expr *)in_RSI;
    }
  }
  else {
    if (*(char *)&in_RSI->pVfs == -0x5b) {
      in_RSI = (sqlite3 *)in_RSI->aDb[in_EDX].pBt;
    }
    pEVar1 = sqlite3ExprDup(in_RSI,(Expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  }
  return pEVar1;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprForVectorField(
  Parse *pParse,       /* Parsing context */
  Expr *pVector,       /* The vector.  List of expressions or a sub-SELECT */
  int iField           /* Which column of the vector to return */
){
  Expr *pRet;
  if( pVector->op==TK_SELECT ){
    assert( pVector->flags & EP_xIsSelect );
    /* The TK_SELECT_COLUMN Expr node:
    **
    ** pLeft:           pVector containing TK_SELECT.  Not deleted.
    ** pRight:          not used.  But recursively deleted.
    ** iColumn:         Index of a column in pVector
    ** iTable:          0 or the number of columns on the LHS of an assignment
    ** pLeft->iTable:   First in an array of register holding result, or 0
    **                  if the result is not yet computed.
    **
    ** sqlite3ExprDelete() specifically skips the recursive delete of
    ** pLeft on TK_SELECT_COLUMN nodes.  But pRight is followed, so pVector
    ** can be attached to pRight to cause this node to take ownership of
    ** pVector.  Typically there will be multiple TK_SELECT_COLUMN nodes
    ** with the same pLeft pointer to the pVector, but only one of them
    ** will own the pVector.
    */
    pRet = sqlite3PExpr(pParse, TK_SELECT_COLUMN, 0, 0);
    if( pRet ){
      pRet->iColumn = iField;
      pRet->pLeft = pVector;
    }
    assert( pRet==0 || pRet->iTable==0 );
  }else{
    if( pVector->op==TK_VECTOR ) pVector = pVector->x.pList->a[iField].pExpr;
    pRet = sqlite3ExprDup(pParse->db, pVector, 0);
  }
  return pRet;
}